

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19bb9b::ProducedDirectoryNodeTask::start
          (ProducedDirectoryNodeTask *this,TaskInterface ti)

{
  pointer *pppCVar1;
  pointer ppCVar2;
  _func_int *p_Var3;
  Node *pNVar4;
  StringRef str;
  Command *pCVar5;
  BuildEngineDelegate *pBVar6;
  TaskInterface local_88;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_78
  ;
  BuildKey local_58;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_38
  ;
  
  local_88.ctx = ti.ctx;
  local_88.impl = ti.impl;
  ppCVar2 = (this->node->producers).
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->node->producers).
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 == 8) {
    pCVar5 = *ppCVar2;
  }
  else {
    local_78.
    super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88.impl;
    local_78.
    super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88.ctx;
    pBVar6 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_78);
    p_Var3 = pBVar6[1]._vptr_BuildEngineDelegate[1];
    pNVar4 = this->node;
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector(&local_78,&pNVar4->producers);
    pCVar5 = (Command *)(**(code **)(*(long *)p_Var3 + 0x88))(p_Var3,pNVar4,&local_78);
    if (local_78.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (pCVar5 == (Command *)0x0) {
    local_78.
    super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88.impl;
    local_78.
    super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88.ctx;
    pBVar6 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_78);
    p_Var3 = pBVar6[1]._vptr_BuildEngineDelegate[1];
    pNVar4 = this->node;
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector(&local_38,&pNVar4->producers);
    (**(code **)(*(long *)p_Var3 + 0x90))(p_Var3,pNVar4,&local_38);
    if (local_38.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    this->isInvalid = true;
  }
  else {
    this->producingCommand = pCVar5;
    str.Data = (pCVar5->name)._M_dataplus._M_p;
    str.Length = (pCVar5->name)._M_string_length;
    llbuild::buildsystem::BuildKey::BuildKey(&local_58,'C',str);
    pppCVar1 = &local_78.
                super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.
    super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pppCVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_58.key.key._M_dataplus._M_p,
               local_58.key.key._M_dataplus._M_p + local_58.key.key._M_string_length);
    llbuild::core::TaskInterface::request(&local_88,(KeyType *)&local_78,0);
    if (local_78.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppCVar1) {
      operator_delete(local_78.
                      super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.key.key._M_dataplus._M_p != &local_58.key.key.field_2) {
      operator_delete(local_58.key.key._M_dataplus._M_p,
                      local_58.key.key.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the producer command.
    auto getCommand = [&]()->Command* {
      if (node.getProducers().size() == 1) {
        return node.getProducers()[0];
      }
      // Give the delegate a chance to resolve to a single command.
      return getBuildSystem(ti).getDelegate().
          chooseCommandFromMultipleProducers(&node, node.getProducers());
    };

    if (Command* foundCommand = getCommand()) {
      producingCommand = foundCommand;
      ti.request(BuildKey::makeCommand(producingCommand->getName()).toData(),
                 /*InputID=*/0);
      return;
    }

    // Notify that we could not resolve to a single producer.
    getBuildSystem(ti).getDelegate().
        cannotBuildNodeDueToMultipleProducers(&node, node.getProducers());
    isInvalid = true;
  }